

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_clip_samples_s24(ma_uint8 *pDst,ma_int64 *pSrc,ma_uint64 count)

{
  long local_48;
  long local_40;
  long local_38;
  ma_int64 s;
  ma_uint64 iSample;
  ma_uint64 count_local;
  ma_int64 *pSrc_local;
  ma_uint8 *pDst_local;
  
  for (iSample = 0; iSample < count; iSample = iSample + 1) {
    local_48 = pSrc[iSample];
    local_38 = local_48;
    if (0x7ffffe < local_48) {
      local_38 = 0x7fffff;
    }
    if (local_38 < -0x800000) {
      local_40 = -0x800000;
    }
    else {
      if (0x7ffffe < local_48) {
        local_48 = 0x7fffff;
      }
      local_40 = local_48;
    }
    pDst[iSample * 3] = (ma_uint8)local_40;
    pDst[iSample * 3 + 1] = (ma_uint8)((ulong)local_40 >> 8);
    pDst[iSample * 3 + 2] = (ma_uint8)((ulong)local_40 >> 0x10);
  }
  return;
}

Assistant:

MA_API void ma_clip_samples_s24(ma_uint8* pDst, const ma_int64* pSrc, ma_uint64 count)
{
    ma_uint64 iSample;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    for (iSample = 0; iSample < count; iSample += 1) {
        ma_int64 s = ma_clip_s24(pSrc[iSample]);
        pDst[iSample*3 + 0] = (ma_uint8)((s & 0x000000FF) >>  0);
        pDst[iSample*3 + 1] = (ma_uint8)((s & 0x0000FF00) >>  8);
        pDst[iSample*3 + 2] = (ma_uint8)((s & 0x00FF0000) >> 16);
    }
}